

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

string * __thiscall
cmTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool contentOnly)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type __dnew;
  string local_58;
  size_type local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetOutputName(&local_58,this,config,false);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = 0x10;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_58.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_58._M_dataplus._M_p,"BUNDLE_EXTENSION",0x10);
  local_58._M_string_length = local_38;
  local_58._M_dataplus._M_p[local_38] = '\0';
  pcVar2 = GetProperty(this,&local_58,this->Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (pcVar2 == (char *)0x0) {
    IsXCTestOnApple(this);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (!contentOnly) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetCFBundleDirectory(const std::string& config,
                                           bool contentOnly) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".";
  const char *ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext)
    {
    if (this->IsXCTestOnApple())
      {
      ext = "xctest";
      }
    else
      {
      ext = "bundle";
      }
    }
  fpath += ext;
  fpath += "/Contents";
  if(!contentOnly)
    fpath += "/MacOS";
  return fpath;
}